

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNEqual
          (UtestShell *this,char *expected,char *actual,size_t length,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  TestResult *pTVar5;
  SimpleString local_138;
  StringEqualFailure local_128;
  SimpleString local_b0;
  StringEqualFailure local_a0;
  char *local_38;
  char *fileName_local;
  char *text_local;
  size_t length_local;
  char *actual_local;
  char *expected_local;
  UtestShell *this_local;
  
  local_38 = fileName;
  fileName_local = text;
  text_local = (char *)length;
  length_local = (size_t)actual;
  actual_local = expected;
  expected_local = (char *)this;
  pTVar5 = getTestResult(this);
  (*pTVar5->_vptr_TestResult[10])();
  pcVar3 = actual_local;
  sVar2 = length_local;
  pcVar1 = local_38;
  if ((length_local != 0) || (actual_local != (char *)0x0)) {
    if ((length_local == 0) || (actual_local == (char *)0x0)) {
      SimpleString::SimpleString(&local_b0,fileName_local);
      StringEqualFailure::StringEqualFailure
                (&local_a0,this,pcVar1,lineNumber,pcVar3,(char *)sVar2,&local_b0);
      (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
      StringEqualFailure::~StringEqualFailure(&local_a0);
      SimpleString::~SimpleString(&local_b0);
    }
    iVar4 = SimpleString::StrNCmp(actual_local,(char *)length_local,(size_t)text_local);
    pcVar3 = actual_local;
    sVar2 = length_local;
    pcVar1 = local_38;
    if (iVar4 != 0) {
      SimpleString::SimpleString(&local_138,fileName_local);
      StringEqualFailure::StringEqualFailure
                (&local_128,this,pcVar1,lineNumber,pcVar3,(char *)sVar2,&local_138);
      (*this->_vptr_UtestShell[0x27])(this,&local_128,testTerminator);
      StringEqualFailure::~StringEqualFailure(&local_128);
      SimpleString::~SimpleString(&local_138);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNEqual(const char* expected, const char* actual, size_t length, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
    if (SimpleString::StrNCmp(expected, actual, length) != 0)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
}